

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Acec_Box_t * Acec_ProduceBox(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Wec_t *local_60;
  Vec_Wec_t *vAddBoxes;
  Vec_Wec_t *vXorLeaves;
  Vec_Int_t *vRanks;
  Vec_Int_t *vXorRoots;
  Vec_Int_t *vTemp;
  Vec_Int_t *vAdds;
  Vec_Int_t *vXors;
  Acec_Box_t *pBox;
  abctime clk;
  Gia_Man_t *pGStack_10;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  clk._4_4_ = fVerbose;
  pGStack_10 = p;
  pBox = (Acec_Box_t *)Abc_Clock();
  vXors = (Vec_Int_t *)0x0;
  vTemp = Ree_ManComputeCuts(pGStack_10,&vAdds,0);
  vRanks = Acec_FindXorRoots(pGStack_10,vAdds);
  vXorLeaves = (Vec_Wec_t *)Acec_RankTrees(pGStack_10,vAdds,vRanks);
  local_60 = (Vec_Wec_t *)0x0;
  Gia_ManLevelNum(pGStack_10);
  if (clk._4_4_ != 0) {
    uVar1 = Ree_ManCountFadds(vTemp);
    iVar2 = Vec_IntSize(vTemp);
    iVar3 = Ree_ManCountFadds(vTemp);
    iVar4 = Vec_IntSize(vAdds);
    printf("Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ",(ulong)uVar1,
           (ulong)(uint)(iVar2 / 6 - iVar3),(long)iVar4 / 4 & 0xffffffff);
  }
  if (clk._4_4_ != 0) {
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar5 - (long)pBox);
  }
  vXorRoots = vRanks;
  vRanks = Acec_OrderTreeRoots(pGStack_10,vTemp,vRanks,(Vec_Int_t *)vXorLeaves);
  Vec_IntFree(vXorRoots);
  Vec_IntFree((Vec_Int_t *)vXorLeaves);
  vXorLeaves = (Vec_Wec_t *)Acec_RankTrees(pGStack_10,vAdds,vRanks);
  vAddBoxes = Acec_FindXorLeaves(pGStack_10,vAdds,vTemp,vRanks,(Vec_Int_t *)vXorLeaves,&local_60);
  Vec_IntFree((Vec_Int_t *)vXorLeaves);
  Acec_TreeVerifyConnections(pGStack_10,vTemp,local_60);
  vXors = (Vec_Int_t *)Acec_FindBox(pGStack_10,vTemp,local_60,vAddBoxes,vRanks);
  if (clk._4_4_ != 0) {
    Acec_TreePrintBox((Acec_Box_t *)vXors,vTemp);
  }
  Vec_IntFree(vRanks);
  Vec_WecFree(vAddBoxes);
  Vec_IntFree(vAdds);
  Vec_IntFree(vTemp);
  return (Acec_Box_t *)vXors;
}

Assistant:

Acec_Box_t * Acec_ProduceBox( Gia_Man_t * p, int fVerbose )
{
    extern void Acec_TreeVerifyConnections( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );

    abctime clk = Abc_Clock();
    Acec_Box_t * pBox = NULL;
    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, 0 );
    Vec_Int_t * vTemp, * vXorRoots = Acec_FindXorRoots( p, vXors ); 
    Vec_Int_t * vRanks = Acec_RankTrees( p, vXors, vXorRoots ); 
    Vec_Wec_t * vXorLeaves, * vAddBoxes = NULL; 

    Gia_ManLevelNum(p);

    //Acec_CheckXors( p, vXors );

    //Ree_ManPrintAdders( vAdds, 1 );
    if ( fVerbose )
        printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    vXorRoots = Acec_OrderTreeRoots( p, vAdds, vTemp = vXorRoots, vRanks );
    Vec_IntFree( vTemp );
    Vec_IntFree( vRanks );

    vRanks = Acec_RankTrees( p, vXors, vXorRoots ); 
    vXorLeaves = Acec_FindXorLeaves( p, vXors, vAdds, vXorRoots, vRanks, &vAddBoxes ); 
    Vec_IntFree( vRanks );

    //printf( "XOR roots after reordering: \n" );
    //Vec_IntPrint( vXorRoots );
    //printf( "XOR leaves: \n" );
    //Vec_WecPrint( vXorLeaves, 0 );
    //printf( "Adder boxes: \n" );
    //Vec_WecPrint( vAddBoxes, 0 );

    Acec_TreeVerifyConnections( p, vAdds, vAddBoxes );

    pBox = Acec_FindBox( p, vAdds, vAddBoxes, vXorLeaves, vXorRoots );
    //Vec_WecFree( vAddBoxes );

    if ( fVerbose )
        Acec_TreePrintBox( pBox, vAdds );

    Vec_IntFree( vXorRoots );
    Vec_WecFree( vXorLeaves );

    Vec_IntFree( vXors );
    Vec_IntFree( vAdds );

    return pBox;
}